

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<float,_signed_char>::Run
          (DataTransform<float,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  int iVar2;
  NumericType NVar3;
  WarningType WVar4;
  float fVar5;
  bool bVar6;
  char *__nptr;
  bool bVar7;
  int *piVar8;
  undefined8 uVar9;
  ostream *poVar10;
  size_t sVar11;
  ulong uVar12;
  char cVar13;
  char data_to_write;
  long lVar14;
  ulong uVar15;
  int iVar16;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  float input_data;
  string word;
  char buffer [128];
  float local_260;
  float local_25c;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  iVar16 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar6 = true;
        bVar7 = false;
      }
      else {
        piVar8 = __errno_location();
        iVar2 = *piVar8;
        *piVar8 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar9 = std::__throw_invalid_argument("stold");
LAB_0013cc25:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar9);
        }
        if (*piVar8 == 0) {
          *piVar8 = iVar2;
        }
        else if (*piVar8 == 0x22) {
          uVar9 = std::__throw_out_of_range("stold");
          goto LAB_0013cc25;
        }
        local_260 = (float)in_ST0;
        bVar6 = false;
        bVar7 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar7) goto LAB_0013c8f9;
      if (bVar6) {
        if (bVar6) {
LAB_0013cbd1:
          bVar7 = true;
          if ((this->is_ascii_output_ == true) && (iVar16 % this->num_column_ != 0)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
LAB_0013cc0f:
          bVar7 = false;
        }
        return bVar7;
      }
    }
    else {
      bVar7 = sptk::ReadStream<float>(&local_260,input_stream);
      if (!bVar7) goto LAB_0013cbd1;
LAB_0013c8f9:
      data_to_write = this->minimum_value_;
      cVar1 = this->maximum_value_;
      cVar13 = (char)(int)local_260;
      if (data_to_write < cVar1) {
        NVar3 = this->input_numeric_type_;
        if (NVar3 == kFloatingPoint) {
          local_25c = local_260;
          in_ST6 = in_ST5;
          if (((float)(short)data_to_write <= local_260) &&
             (data_to_write = cVar1, local_260 <= (float)(short)cVar1)) goto LAB_0013c9dd;
        }
        else {
          uVar12 = (ulong)cVar1;
          if (NVar3 == kUnsignedInteger) {
            uVar15 = (long)(local_260 - 9.223372e+18) & (long)local_260 >> 0x3f | (long)local_260;
            if ((ulong)(long)data_to_write <= uVar15) {
              bVar7 = uVar12 < uVar15;
              data_to_write = cVar13;
              if (bVar7) {
                data_to_write = cVar1;
              }
              goto LAB_0013c9e1;
            }
          }
          else {
            if (NVar3 != kSignedInteger) goto LAB_0013c9dd;
            lVar14 = (long)local_260;
            if (data_to_write <= lVar14) {
              bVar7 = (long)uVar12 < lVar14;
              data_to_write = cVar13;
              if ((long)uVar12 < lVar14) {
                data_to_write = cVar1;
              }
              goto LAB_0013c9e1;
            }
          }
        }
LAB_0013ca17:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar4 == kExit) goto LAB_0013cc0f;
        }
      }
      else {
LAB_0013c9dd:
        bVar7 = false;
        data_to_write = cVar13;
LAB_0013c9e1:
        if ((bVar7) || (this->rounding_ == false)) {
          if (bVar7) goto LAB_0013ca17;
        }
        else {
          if (local_260 <= 0.0) {
            fVar5 = local_260 + -0.5;
          }
          else {
            fVar5 = local_260 + 0.5;
          }
          data_to_write = (char)(int)fVar5;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<signed_char>(data_to_write,local_238,0x80,local_b8);
        if (!bVar7) goto LAB_0013cc0f;
        sVar11 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar11);
        if ((iVar16 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          in_ST7 = in_ST6;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar7 = sptk::WriteStream<signed_char>(data_to_write,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar7) goto LAB_0013cc0f;
      }
    }
    iVar16 = iVar16 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }